

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionGeneralizationImpl.hpp
# Opt level: O0

void __thiscall
Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>::
MonomSet(MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,SymbolId var,
        Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
        *poly)

{
  bool bVar1;
  byte bVar2;
  Elem this_00;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *in_RDX;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *monom;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range3;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_fffffffffffffed8
  ;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_fffffffffffffee0
  ;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_stack_fffffffffffffef0
  ;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this_01;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_ffffffffffffff28;
  undefined1 local_70 [32];
  undefined1 *local_50;
  
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (in_stack_fffffffffffffef0,CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)
            );
  MonomSet((MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_> *)in_stack_fffffffffffffee0,
           in_stack_fffffffffffffed8);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
            (in_stack_fffffffffffffee0);
  this_01 = in_RDI;
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::operator->(in_RDX);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::nSummands
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x73c080);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
            (this_01,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::operator->(in_RDX);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)in_stack_fffffffffffffee0)
  ;
  local_50 = local_70;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)in_stack_fffffffffffffed8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
         *)in_stack_fffffffffffffed8);
  while (bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffee0,
                                 (StlIter *)in_stack_fffffffffffffed8), bVar1) {
    this_00 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
              ::StlIter::operator*((StlIter *)0x73c12b);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::tryVar
              (in_stack_ffffffffffffff28);
    Lib::some<Kernel::Variable>((SymbolId *)in_stack_fffffffffffffed8);
    bVar2 = Lib::operator!=((Option<Kernel::Variable> *)in_stack_fffffffffffffee0,
                            (Option<Kernel::Variable> *)in_stack_fffffffffffffed8);
    Lib::Option<Kernel::Variable>::~Option((Option<Kernel::Variable> *)0x73c195);
    Lib::Option<Kernel::Variable>::~Option((Option<Kernel::Variable> *)0x73c1a2);
    if ((bVar2 & 1) != 0) {
      in_stack_fffffffffffffee0 = in_RDI;
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
                (this_00,(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                         CONCAT17(bVar2,in_stack_fffffffffffffee8));
      Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::push
                ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)this_00,
                 (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffee8));
      Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x73c1e8);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

MonomSet(Variable var, Perfect<Polynom<NumTraits>> poly) : MonomSet(decltype(_cancellable)()) 
  {
    _cancellable.reserve(poly->nSummands() - 1);
    for (auto const& monom : poly->iterSummands()) {
      if (monom.tryVar() != some(var)) {
        _cancellable.push(monom);
      }
    }
  }